

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O3

void __thiscall amrex::TagBoxArray::coarsen(TagBoxArray *this,IntVect *ratio)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  int dir;
  Box result_1;
  Box result;
  IntVect new_n_grow;
  MFIter mfi;
  undefined8 local_128;
  uint local_120;
  uint local_11c [3];
  IndexType IStack_110;
  Box local_108;
  int local_ec [3];
  IntVect *local_e0;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Box local_ac;
  MFIter local_90;
  
  local_ec[0] = 0;
  local_ec[1] = 0;
  local_ec[2] = 0;
  local_e0 = &(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow;
  lVar7 = 0;
  do {
    local_ec[lVar7] =
         ((this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect[lVar7] +
          ratio->vect[lVar7] + -1) / ratio->vect[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  MFIter::MFIter(&local_90,(FabArrayBase *)this,(ParallelDescriptor::m_Team._4_4_ != 1) * '\x02');
  if (local_90.currentIndex < local_90.endIndex) {
    local_c8 = CONCAT44(local_ec[2],local_ec[1]);
    uStack_c0 = 0;
    local_d8 = local_ec[0];
    iStack_d4 = local_ec[1];
    iStack_d0 = local_ec[2];
    iStack_cc = local_ec[0];
    do {
      BATransformer::operator()
                (&local_ac,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      local_11c[1] = local_ac.bigend.vect[1];
      local_11c[2] = local_ac.bigend.vect[2];
      IStack_110.itype = local_ac.btype.itype;
      local_128._0_4_ = local_ac.smallend.vect[0];
      local_128._4_4_ = local_ac.smallend.vect[1];
      lVar7 = local_128;
      local_120 = local_ac.smallend.vect[2];
      local_11c[0] = local_ac.bigend.vect[0];
      iVar1 = ratio->vect[0];
      iVar2 = ratio->vect[1];
      local_128._4_4_ = local_ac.smallend.vect[1];
      uVar3 = local_128._4_4_;
      if (iVar2 == 1 && iVar1 == 1) {
        iVar8 = ratio->vect[2];
        local_128 = lVar7;
        if (iVar8 != 1) goto LAB_004ac38e;
      }
      else {
        local_128._0_4_ = local_ac.smallend.vect[0];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if ((int)(uint)local_128 < 0) {
              local_128._0_4_ = (int)(uint)local_128 >> 2;
            }
            else {
              local_128._0_4_ = (uint)local_128 >> 2;
            }
          }
          else if (iVar1 == 2) {
            if ((int)(uint)local_128 < 0) {
              local_128._0_4_ = (int)(uint)local_128 >> 1;
            }
            else {
              local_128._0_4_ = (uint)local_128 >> 1;
            }
          }
          else if ((int)(uint)local_128 < 0) {
            local_128._0_4_ = ~((int)~(uint)local_128 / iVar1);
          }
          else {
            local_128._0_4_ = (int)(uint)local_128 / iVar1;
          }
        }
        if (iVar2 != 1) {
          if (iVar2 == 4) {
            if ((long)local_ac.smallend.vect._0_8_ < 0) {
              uVar3 = (int)local_128._4_4_ >> 2;
            }
            else {
              uVar3 = local_128._4_4_ >> 2;
            }
          }
          else if (iVar2 == 2) {
            if ((long)local_ac.smallend.vect._0_8_ < 0) {
              uVar3 = (int)local_128._4_4_ >> 1;
            }
            else {
              uVar3 = local_128._4_4_ >> 1;
            }
          }
          else if ((long)local_ac.smallend.vect._0_8_ < 0) {
            uVar3 = ~((int)~local_128._4_4_ / iVar2);
          }
          else {
            uVar3 = (int)local_128._4_4_ / iVar2;
          }
        }
        iVar8 = ratio->vect[2];
LAB_004ac38e:
        local_128 = CONCAT44(uVar3,(uint)local_128);
        if (iVar8 != 1) {
          if (iVar8 == 4) {
            if (local_ac.smallend.vect[2] < 0) {
              local_120 = local_ac.smallend.vect[2] >> 2;
            }
            else {
              local_120 = (uint)local_ac.smallend.vect[2] >> 2;
            }
          }
          else if (iVar8 == 2) {
            if (local_ac.smallend.vect[2] < 0) {
              local_120 = local_ac.smallend.vect[2] >> 1;
            }
            else {
              local_120 = (uint)local_ac.smallend.vect[2] >> 1;
            }
          }
          else if (local_ac.smallend.vect[2] < 0) {
            local_120 = ~(~local_ac.smallend.vect[2] / iVar8);
          }
          else {
            local_120 = local_ac.smallend.vect[2] / iVar8;
          }
        }
        IStack_110.itype = local_ac.btype.itype;
        local_11c[2] = local_ac.bigend.vect[2];
        if (IStack_110.itype == 0) {
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              local_11c[0] = local_ac.bigend.vect[0] >> 2;
              if (-1 < local_ac.bigend.vect[0]) {
                local_11c[0] = (uint)local_ac.bigend.vect[0] >> 2;
              }
            }
            else if (iVar1 == 2) {
              local_11c[0] = local_ac.bigend.vect[0] >> 1;
              if (-1 < local_ac.bigend.vect[0]) {
                local_11c[0] = (uint)local_ac.bigend.vect[0] >> 1;
              }
            }
            else if (local_ac.bigend.vect[0] < 0) {
              local_11c[0] = ~(~local_ac.bigend.vect[0] / iVar1);
            }
            else {
              local_11c[0] = local_ac.bigend.vect[0] / iVar1;
            }
          }
          if (iVar2 != 1) {
            if (iVar2 == 4) {
              local_11c[1] = local_ac.bigend.vect[1] >> 2;
              if (-1 < local_ac.bigend.vect[1]) {
                local_11c[1] = (uint)local_ac.bigend.vect[1] >> 2;
              }
            }
            else if (iVar2 == 2) {
              local_11c[1] = local_ac.bigend.vect[1] >> 1;
              if (-1 < local_ac.bigend.vect[1]) {
                local_11c[1] = (uint)local_ac.bigend.vect[1] >> 1;
              }
            }
            else if (local_ac.bigend.vect[1] < 0) {
              local_11c[1] = ~(~local_ac.bigend.vect[1] / iVar2);
            }
            else {
              local_11c[1] = local_ac.bigend.vect[1] / iVar2;
            }
          }
          uVar3 = local_11c[2];
          if (iVar8 != 1) {
            if (iVar8 == 4) {
              uVar3 = (int)local_11c[2] >> 2;
              if (-1 < (int)local_11c[2]) {
                uVar3 = local_11c[2] >> 2;
              }
            }
            else if (iVar8 == 2) {
              uVar3 = (int)local_11c[2] >> 1;
              if (-1 < (int)local_11c[2]) {
                uVar3 = local_11c[2] >> 1;
              }
            }
            else if ((int)local_11c[2] < 0) {
              uVar3 = ~((int)~local_11c[2] / iVar8);
            }
            else {
              uVar3 = (int)local_11c[2] / iVar8;
            }
          }
        }
        else {
          local_108.smallend.vect[0] = 0;
          local_108.smallend.vect[1] = 0;
          local_108.smallend.vect[2] = 0;
          lVar7 = 0;
          do {
            if (((IStack_110.itype >> ((uint)lVar7 & 0x1f) & 1) != 0) &&
               ((int)local_11c[lVar7] % ratio->vect[lVar7] != 0)) {
              local_108.smallend.vect[lVar7] = 1;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          uVar3 = local_ac.bigend.vect[0];
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              uVar3 = local_ac.bigend.vect[0] >> 2;
              if (-1 < local_ac.bigend.vect[0]) {
                uVar3 = (uint)local_ac.bigend.vect[0] >> 2;
              }
            }
            else if (iVar1 == 2) {
              uVar3 = local_ac.bigend.vect[0] >> 1;
              if (-1 < local_ac.bigend.vect[0]) {
                uVar3 = (uint)local_ac.bigend.vect[0] >> 1;
              }
            }
            else if (local_ac.bigend.vect[0] < 0) {
              uVar3 = ~(~local_ac.bigend.vect[0] / iVar1);
            }
            else {
              uVar3 = local_ac.bigend.vect[0] / iVar1;
            }
          }
          uVar6 = local_ac.bigend.vect[1];
          if (iVar2 != 1) {
            if (iVar2 == 4) {
              uVar6 = local_ac.bigend.vect[1] >> 2;
              if (-1 < local_ac.bigend.vect[1]) {
                uVar6 = (uint)local_ac.bigend.vect[1] >> 2;
              }
            }
            else if (iVar2 == 2) {
              uVar6 = local_ac.bigend.vect[1] >> 1;
              if (-1 < local_ac.bigend.vect[1]) {
                uVar6 = (uint)local_ac.bigend.vect[1] >> 1;
              }
            }
            else if (local_ac.bigend.vect[1] < 0) {
              uVar6 = ~(~local_ac.bigend.vect[1] / iVar2);
            }
            else {
              uVar6 = local_ac.bigend.vect[1] / iVar2;
            }
          }
          uVar4 = local_11c[2];
          if (iVar8 != 1) {
            if (iVar8 == 4) {
              uVar4 = (int)local_11c[2] >> 2;
              if (-1 < (int)local_11c[2]) {
                uVar4 = local_11c[2] >> 2;
              }
            }
            else if (iVar8 == 2) {
              uVar4 = (int)local_11c[2] >> 1;
              if (-1 < (int)local_11c[2]) {
                uVar4 = local_11c[2] >> 1;
              }
            }
            else if ((int)local_11c[2] < 0) {
              uVar4 = ~((int)~local_11c[2] / iVar8);
            }
            else {
              uVar4 = (int)local_11c[2] / iVar8;
            }
          }
          local_11c[0] = uVar3 + local_108.smallend.vect[0];
          local_11c[1] = uVar6 + local_108.smallend.vect[1];
          uVar3 = uVar4 + local_108.smallend.vect[2];
        }
        local_11c[2] = uVar3;
      }
      local_108.btype.itype = IStack_110.itype;
      local_108.smallend.vect[0] = (int)local_128;
      local_108.smallend.vect[1] = (int)((ulong)local_128 >> 0x20);
      local_108.smallend.vect[2] = local_120 - iStack_d0;
      local_108.bigend.vect[0] = local_11c[0] + iStack_cc;
      local_108.smallend.vect[1] = local_108.smallend.vect[1] - iStack_d4;
      local_108.smallend.vect[0] = local_108.smallend.vect[0] - local_d8;
      local_108.bigend.vect[1] = local_11c[1] + (int)local_c8;
      local_108.bigend.vect[2] = local_11c[2] + local_c8._4_4_;
      piVar5 = &local_90.currentIndex;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar5 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_90.currentIndex;
      }
      TagBox::coarsen((this->super_FabArray<amrex::TagBox>).m_fabs_v.
                      super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
                      super__Vector_impl_data._M_start[*piVar5],ratio,&local_108);
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  BoxArray::coarsen(&(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.boxarray,ratio);
  *(ulong *)local_e0->vect = CONCAT44(local_ec[1],local_ec[0]);
  local_e0->vect[2] = local_ec[2];
  return;
}

Assistant:

void
TagBoxArray::coarsen (const IntVect & ratio)
{
    // If team is used, all team workers need to go through all the fabs,
    // including ones they don't own.
    int teamsize = ParallelDescriptor::TeamSize();
    unsigned char flags = (teamsize == 1) ? 0 : MFIter::AllBoxes;

    IntVect new_n_grow;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        new_n_grow[idim] = (n_grow[idim]+ratio[idim]-1)/ratio[idim];
    }

#if defined(AMREX_USE_OMP)
#pragma omp parallel if (teamsize == 1 && Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*this,flags); mfi.isValid(); ++mfi)
    {
        Box const& cbox = amrex::grow(amrex::coarsen(mfi.validbox(),ratio),new_n_grow);
        this->fabPtr(mfi)->coarsen(ratio,cbox);
    }

    boxarray.coarsen(ratio);
    n_grow = new_n_grow;
}